

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::ICUTransService::compareIString(ICUTransService *this,XMLCh *comp1,XMLCh *comp2)

{
  XMLCh *pXVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  int unaff_EBX;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  lVar8 = 0;
  lVar9 = 0;
  do {
    pXVar1 = comp1 + lVar9;
    uVar6 = (uint)(ushort)*pXVar1;
    if ((uVar6 & 0xfc00) == 0xd800) {
      lVar2 = lVar9 + 1;
      lVar9 = lVar9 + 2;
      uVar6 = (uint)(ushort)*pXVar1 * 0x400 + (uint)(ushort)comp1[lVar2] + 0xfca02400;
    }
    else {
      lVar9 = lVar9 + 1;
    }
    pXVar1 = comp2 + lVar8;
    uVar7 = (uint)(ushort)*pXVar1;
    if ((uVar7 & 0xfc00) == 0xd800) {
      lVar2 = lVar8 + 1;
      lVar8 = lVar8 + 2;
      uVar7 = (uint)(ushort)*pXVar1 * 0x400 + (uint)(ushort)comp2[lVar2] + 0xfca02400;
    }
    else {
      lVar8 = lVar8 + 1;
    }
    iVar3 = u_foldCase_70(uVar6,0);
    iVar4 = u_foldCase_70(uVar7,0);
    cVar5 = (uVar6 == 0) * '\x02';
    if (iVar3 - iVar4 != 0) {
      cVar5 = '\x01';
      unaff_EBX = iVar3 - iVar4;
    }
  } while (cVar5 == '\0');
  if (cVar5 == '\x02') {
    unaff_EBX = 0;
  }
  return unaff_EBX;
}

Assistant:

int ICUTransService::compareIString(const   XMLCh* const    comp1
                                    , const XMLCh* const    comp2)
{
    size_t  i = 0;
    size_t  j = 0;

    for(;;)
    {
        UChar32 ch1;
        UChar32 ch2;

        U16_NEXT_UNSAFE(comp1, i, ch1);
        U16_NEXT_UNSAFE(comp2, j, ch2);

        const UChar32   folded1 =
            u_foldCase(ch1, U_FOLD_CASE_DEFAULT);

        const UChar32   folded2 =
            u_foldCase(ch2, U_FOLD_CASE_DEFAULT);

        if (folded1 !=
            folded2)
        {
            return folded1 - folded2;
        }
        else if (ch1 == 0)
        {
            // If ch1 is 0, the ch2 must also be
            // 0.  Otherwise, the previous if
            // would have failed.
            break;
        }
    }

    return 0;
}